

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void doctest::anon_unknown_15::FatalConditionHandler::handleSignal(int sig)

{
  int *piVar1;
  pointer ppIVar2;
  IReporter *pIVar3;
  ContextState *pCVar4;
  long *__src;
  size_t sVar5;
  pointer pSVar6;
  long lVar7;
  IReporter **curr_rep;
  pointer ppIVar8;
  char *pcVar9;
  bool bVar10;
  allocator<char> local_75;
  int local_74;
  long *local_70 [2];
  long local_60 [2];
  anon_union_24_2_13149d16_for_String_3 local_50;
  undefined1 local_38;
  
  pcVar9 = "<unknown signal>";
  lVar7 = 8;
  do {
    if (*(int *)((long)&PTR_typeinfo_name_001a1108 + lVar7) == sig) {
      pcVar9 = *(char **)((long)&(anonymous_namespace)::signalDefs + lVar7);
      break;
    }
    bVar10 = lVar7 != 0x58;
    lVar7 = lVar7 + 0x10;
  } while (bVar10);
  local_74 = sig;
  reset();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pcVar9,&local_75);
  pCVar4 = detail::g_cs;
  piVar1 = &(detail::g_cs->super_CurrentTestCaseStats).failure_flags;
  *piVar1 = *piVar1 | 4;
  ppIVar8 = (pCVar4->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar2 = (pCVar4->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar8 != ppIVar2) {
    do {
      __src = local_70[0];
      pIVar3 = *ppIVar8;
      sVar5 = strlen((char *)local_70[0]);
      pcVar9 = String::allocate((String *)&local_50.data,(size_type)sVar5);
      memcpy(pcVar9,__src,sVar5 & 0xffffffff);
      local_38 = 1;
      (*pIVar3->_vptr_IReporter[6])(pIVar3,&local_50);
      if ((local_50.buf[0x17] < '\0') && (local_50.data.ptr != (char *)0x0)) {
        operator_delete__(local_50.data.ptr);
      }
      ppIVar8 = ppIVar8 + 1;
    } while (ppIVar8 != ppIVar2);
  }
  pSVar6 = (detail::g_cs->subcaseStack).
           super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar6 != (detail::g_cs->subcaseStack).
                super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    do {
      (detail::g_cs->subcaseStack).
      super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>.
      _M_impl.super__Vector_impl_data._M_finish = pSVar6 + -1;
      if ((pSVar6[-1].m_name.field_0.buf[0x17] < '\0') &&
         (pcVar9 = pSVar6[-1].m_name.field_0.data.ptr, pcVar9 != (char *)0x0)) {
        operator_delete__(pcVar9);
      }
      ppIVar2 = (detail::g_cs->reporters_currently_used).
                super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar8 = (detail::g_cs->reporters_currently_used).
                     super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppIVar8 != ppIVar2;
          ppIVar8 = ppIVar8 + 1) {
        (*(*ppIVar8)->_vptr_IReporter[8])();
      }
      pSVar6 = (detail::g_cs->subcaseStack).
               super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (pSVar6 != (detail::g_cs->subcaseStack).
                       super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  detail::ContextState::finalizeTestCaseData(detail::g_cs);
  ppIVar2 = (detail::g_cs->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar8 = (detail::g_cs->reporters_currently_used).
                 super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppIVar8 != ppIVar2; ppIVar8 = ppIVar8 + 1
      ) {
    (*(*ppIVar8)->_vptr_IReporter[5])(*ppIVar8,&detail::g_cs->super_CurrentTestCaseStats);
  }
  ppIVar2 = (detail::g_cs->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar8 = (detail::g_cs->reporters_currently_used).
                 super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppIVar8 != ppIVar2; ppIVar8 = ppIVar8 + 1
      ) {
    (*(*ppIVar8)->_vptr_IReporter[2])(*ppIVar8,&detail::g_cs->super_TestRunStats);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  raise(local_74);
  return;
}

Assistant:

static void handleSignal(int sig) {
            const char* name = "<unknown signal>";
            for(std::size_t i = 0; i < DOCTEST_COUNTOF(signalDefs); ++i) {
                SignalDefs& def = signalDefs[i];
                if(sig == def.id) {
                    name = def.name;
                    break;
                }
            }
            reset();
            reportFatal(name);
            raise(sig);
        }